

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall tl::Vector<anims::NodeData>::reserve(Vector<anims::NodeData> *this,size_t capacity)

{
  NodeData *__dest;
  NodeData *data;
  size_t capacity_local;
  Vector<anims::NodeData> *this_local;
  
  if (this->_capacity < capacity) {
    __dest = (NodeData *)operator_new__(capacity * 0x18);
    if (this->_data != (NodeData *)0x0) {
      memcpy(__dest,this->_data,this->_size * 0x18);
      if (this->_data != (NodeData *)0x0) {
        operator_delete__(this->_data);
      }
    }
    this->_data = __dest;
    this->_capacity = capacity;
  }
  return;
}

Assistant:

void Vector<T>::reserve(size_t capacity)noexcept
{
    if(capacity > _capacity) {
        T* data = reinterpret_cast<T*>(new char[sizeof(T) * capacity]);
        if(_data) {
            memcpy(data, _data, _size * sizeof(T));
            delete[] (char*)_data;
        }
        _data = data;
        _capacity = capacity;
    }
}